

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int str_find_aux(lua_State *L,int find)

{
  ulong uVar1;
  char *__s1;
  char cVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  char *p;
  lua_Integer pos;
  size_t n;
  char *pcVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  char *__n;
  ulong uVar9;
  size_t lp;
  int local_264;
  size_t ls;
  MatchState ms;
  
  pcVar5 = luaL_checklstring(L,1,&ls);
  p = luaL_checklstring(L,2,&lp);
  pos = luaL_optinteger(L,3,1);
  sVar8 = ls;
  n = posrelatI(pos,ls);
  uVar1 = n - 1;
  if (sVar8 < uVar1) {
    lua_pushnil(L);
  }
  else {
    sVar8 = lp;
    local_264 = find;
    if (find == 0) {
LAB_0011e599:
      cVar2 = *p;
      if (cVar2 == '^') {
        p = p + 1;
        sVar8 = sVar8 - 1;
        lp = sVar8;
      }
      ms.matchdepth = 200;
      ms.src_end = pcVar5 + ls;
      ms.p_end = p + sVar8;
      ms.src_init = pcVar5;
      ms.L = L;
      do {
        lVar3 = n - 1;
        ms.level = '\0';
        pcVar6 = match(&ms,pcVar5 + lVar3,p);
        if (pcVar6 != (char *)0x0) {
          if (local_264 != 0) {
            lua_pushinteger(L,n);
            lua_pushinteger(L,(long)pcVar6 - (long)pcVar5);
            iVar4 = push_captures(&ms,(char *)0x0,(char *)0x0);
            return iVar4 + 2;
          }
          iVar4 = push_captures(&ms,pcVar5 + (n - 1),pcVar6);
          return iVar4;
        }
      } while ((cVar2 != '^') && (n = n + 1, pcVar5 + lVar3 < ms.src_end));
    }
    else {
      iVar4 = lua_toboolean(L,4);
      sVar8 = lp;
      if (iVar4 == 0) {
        uVar9 = 0;
        do {
          pcVar6 = strpbrk(p + uVar9,"^$*+?.([%-");
          if (pcVar6 != (char *)0x0) goto LAB_0011e599;
          sVar7 = strlen(p + uVar9);
          uVar9 = uVar9 + sVar7 + 1;
        } while (uVar9 <= sVar8);
      }
      pcVar6 = pcVar5 + uVar1;
      if (sVar8 == 0) {
        if (pcVar5 != (char *)0x0) {
LAB_0011e67f:
          lua_pushinteger(L,(lua_Integer)(pcVar6 + (1 - (long)pcVar5)));
          lua_pushinteger(L,(lua_Integer)(pcVar6 + (lp - (long)pcVar5)));
          return 2;
        }
      }
      else if (sVar8 <= ls - uVar1) {
        __n = (char *)((ls - uVar1) - (sVar8 - 1));
        __s = pcVar6;
        while ((__n != (char *)0x0 &&
               (pcVar6 = (char *)memchr(__s,(int)*p,(size_t)__n), pcVar6 != (char *)0x0))) {
          __s1 = pcVar6 + 1;
          iVar4 = bcmp(__s1,p + 1,sVar8 - 1);
          if (iVar4 == 0) goto LAB_0011e67f;
          __n = __s + ((long)__n - (long)__s1);
          __s = __s1;
        }
      }
    }
    lua_pushnil(L);
  }
  return 1;
}

Assistant:

static int str_find_aux (lua_State *L, int find) {
  size_t ls, lp;
  const char *s = luaL_checklstring(L, 1, &ls);
  const char *p = luaL_checklstring(L, 2, &lp);
  size_t init = posrelatI(luaL_optinteger(L, 3, 1), ls) - 1;
  if (init > ls) {  /* start after string's end? */
    luaL_pushfail(L);  /* cannot find anything */
    return 1;
  }
  /* explicit request or no special characters? */
  if (find && (lua_toboolean(L, 4) || nospecials(p, lp))) {
    /* do a plain search */
    const char *s2 = lmemfind(s + init, ls - init, p, lp);
    if (s2) {
      lua_pushinteger(L, (s2 - s) + 1);
      lua_pushinteger(L, (s2 - s) + lp);
      return 2;
    }
  }
  else {
    MatchState ms;
    const char *s1 = s + init;
    int anchor = (*p == '^');
    if (anchor) {
      p++; lp--;  /* skip anchor character */
    }
    prepstate(&ms, L, s, ls, p, lp);
    do {
      const char *res;
      reprepstate(&ms);
      if ((res=match(&ms, s1, p)) != NULL) {
        if (find) {
          lua_pushinteger(L, (s1 - s) + 1);  /* start */
          lua_pushinteger(L, res - s);   /* end */
          return push_captures(&ms, NULL, 0) + 2;
        }
        else
          return push_captures(&ms, s1, res);
      }
    } while (s1++ < ms.src_end && !anchor);
  }
  luaL_pushfail(L);  /* not found */
  return 1;
}